

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distorm.c
# Opt level: O1

void distorm_format64(_CodeInfo *ci,_DInst *di,_DecodedInst *result)

{
  uchar *puVar1;
  uint8_t uVar2;
  byte bVar3;
  uint16_t uVar4;
  ushort uVar5;
  undefined8 uVar6;
  _WRegister *p_Var7;
  uchar uVar8;
  uchar uVar9;
  uchar uVar10;
  uchar uVar11;
  uchar uVar12;
  undefined1 uVar13;
  undefined1 uVar14;
  ulong uVar15;
  byte bVar16;
  uchar *puVar17;
  uint uVar18;
  uint64_t x;
  uint uVar19;
  int opNum;
  ulong uVar20;
  _OffsetType addrMask;
  bool bVar21;
  uchar *str;
  uchar *local_58;
  uint local_50;
  int local_4c;
  _DecodedInst *local_48;
  uchar *local_40;
  _CodeInfo *local_38;
  
  uVar18 = ci->features;
  if ((short)uVar18 < 0) {
    addrMask = ci->addrMask;
  }
  else {
    addrMask = 0xffffffff;
    if ((uVar18 & 2) == 0) {
      addrMask = -(ulong)((uVar18 & 1) == 0) | 0xffff;
    }
  }
  str_hex(&result->instructionHex,ci->code + (uint)((int)di->addr - (int)ci->codeOffset),
          (uint)di->size);
  if (di->flags == 0xffff) {
    bVar3 = di->size;
    bVar16 = (di->imm).byte;
    result->offset = addrMask & di->addr;
    result->size = (uint)bVar3;
    builtin_memcpy((result->mnemonic).p,"DB  ",4);
    local_58 = (result->mnemonic).p + 3;
    str_int_impl(&local_58,(ulong)bVar16);
    *local_58 = '\0';
    (result->mnemonic).length = (int)local_58 - ((int)result + 0x10);
    (result->operands).length = 0;
    (result->operands).p[0] = '\0';
    (result->operands).p[1] = '\0';
    (result->operands).p[2] = '\0';
    (result->operands).p[3] = '\0';
    return;
  }
  local_40 = (result->operands).p;
  local_4c = *(int *)&di->opcode + -0x127;
  local_50 = 0xffffffff;
  if ((ushort)local_4c < 0x19) {
    local_50 = 0;
    if ((0x80 < di->segment) &&
       (local_50 = 0, ci->dt == (di->flags >> 10 & (Decode64Bits|Decode32Bits)))) {
      local_50 = (uint)(di->ops[0].size >> 3);
      local_58 = local_40;
      goto LAB_00103530;
    }
  }
  local_58 = local_40;
  if (di->opsNo == '\0') {
LAB_00103530:
    *local_58 = '\0';
    (result->operands).length = (int)local_58 - (int)local_40;
    uVar5 = di->opcode;
    uVar20 = di->addr;
    puVar1 = (result->mnemonic).p;
    bVar3 = di->size;
    local_58 = puVar1;
    if ((di->flags & 7) != 0) {
      uVar18 = (di->flags & 7) + (uint)(uVar5 == 0x13f) + (uint)(uVar5 == 0x12d);
      *(uint8_t (*) [8])puVar1 = prefixTable[uVar18];
      local_58 = puVar1 + prefixSizesTable[uVar18];
    }
    uVar6 = *(undefined8 *)("\tUNDEFINED" + (ulong)uVar5 + 9);
    *(undefined8 *)local_58 = *(undefined8 *)("\tUNDEFINED" + (ulong)uVar5 + 1);
    *(undefined8 *)(local_58 + 8) = uVar6;
    puVar17 = local_58 + "\tUNDEFINED"[uVar5];
    local_58 = puVar17;
    if (0 < (int)local_50) {
      local_58 = puVar17 + 1;
      *puVar17 = ""[local_50];
    }
    *local_58 = '\0';
    (result->mnemonic).length = (int)local_58 - (int)puVar1;
    result->offset = addrMask & uVar20;
    result->size = (uint)bVar3;
    return;
  }
  uVar20 = 0;
  local_48 = result;
  local_38 = ci;
LAB_00103112:
  uVar2 = di->ops[uVar20].type;
  if (uVar20 != 0) {
    local_58[0] = ',';
    local_58[1] = ' ';
    local_58 = local_58 + 2;
  }
  opNum = (int)uVar20;
  switch(uVar2) {
  case '\x01':
    bVar3 = di->ops[uVar20].index;
    p_Var7 = _REGISTERS + bVar3;
    uVar8 = p_Var7->p[1];
    uVar9 = p_Var7->p[2];
    uVar10 = p_Var7->p[3];
    uVar11 = p_Var7->p[4];
    uVar12 = p_Var7->p[5];
    uVar13 = p_Var7->field_0xa;
    uVar14 = p_Var7->field_0xb;
    local_58[0] = p_Var7->p[0];
    local_58[1] = uVar8;
    local_58[2] = uVar9;
    local_58[3] = uVar10;
    local_58[4] = uVar11;
    local_58[5] = uVar12;
    local_58[6] = uVar13;
    local_58[7] = uVar14;
    local_58 = local_58 + _REGISTERS[bVar3].length;
    break;
  case '\x02':
    if ((di->opcode == 0x10) && (di->ops[uVar20].size != 8)) {
      distorm_format_size(&local_58,di,opNum);
    }
    if ((((di->flags & 0x20) == 0) || (di->ops[uVar20].size != 8)) || (-1 < (di->imm).sbyte)) {
      if (di->ops[uVar20].size == 0x20) goto switchD_0010313d_caseD_3;
      x = (di->imm).qword;
    }
    else {
      *local_58 = '-';
      local_58 = local_58 + 1;
      x = -(long)(di->imm).sbyte;
    }
    goto LAB_0010338f;
  case '\x03':
switchD_0010313d_caseD_3:
    x = (uint64_t)(di->imm).dword;
    goto LAB_0010338f;
  case '\x04':
    goto switchD_0010313d_caseD_4;
  case '\x05':
    distorm_format_size(&local_58,di,opNum);
    *local_58 = '[';
    local_58 = local_58 + 1;
    if (di->segment < 0x81) {
      uVar18 = di->segment & 0x7f;
      p_Var7 = _REGISTERS + uVar18;
      uVar8 = p_Var7->p[1];
      uVar9 = p_Var7->p[2];
      uVar10 = p_Var7->p[3];
      uVar11 = p_Var7->p[4];
      uVar12 = p_Var7->p[5];
      uVar13 = p_Var7->field_0xa;
      uVar14 = p_Var7->field_0xb;
      local_58[0] = p_Var7->p[0];
      local_58[1] = uVar8;
      local_58[2] = uVar9;
      local_58[3] = uVar10;
      local_58[4] = uVar11;
      local_58[5] = uVar12;
      local_58[6] = uVar13;
      local_58[7] = uVar14;
      uVar18 = _REGISTERS[uVar18].length;
      local_58[uVar18] = ':';
      local_58 = local_58 + (ulong)uVar18 + 1;
    }
    str_int_impl(&local_58,di->disp & addrMask);
    goto LAB_00103467;
  case '\x06':
    distorm_format_size(&local_58,di,opNum);
    *local_58 = '[';
    local_58 = local_58 + 1;
    bVar3 = di->segment;
    bVar16 = bVar3 & 0x7f;
    if (bVar3 == 0xff) {
      bVar16 = 0xff;
    }
    bVar21 = (char)bVar3 < -1;
    uVar18 = (uint)bVar16;
    if ((ushort)local_4c < 0x19) {
      uVar4 = di->opcode;
      uVar19 = 0x44;
      if ((((uVar20 == 0 && uVar4 == 0x127) || (uVar20 == 1 && uVar4 == 0x12d)) ||
          (((char)bVar3 < -1 && ((uVar19 = 0x47, uVar4 == 0x12d || (bVar21 = true, uVar4 == 0x127)))
           ))) && (bVar21 = local_38->dt == Decode64Bits, !bVar21)) {
        uVar18 = uVar19;
      }
    }
    if (!(bool)(uVar18 == 0xff | bVar21)) {
      p_Var7 = _REGISTERS + uVar18;
      uVar8 = p_Var7->p[1];
      uVar9 = p_Var7->p[2];
      uVar10 = p_Var7->p[3];
      uVar11 = p_Var7->p[4];
      uVar12 = p_Var7->p[5];
      uVar13 = p_Var7->field_0xa;
      uVar14 = p_Var7->field_0xb;
      local_58[0] = p_Var7->p[0];
      local_58[1] = uVar8;
      local_58[2] = uVar9;
      local_58[3] = uVar10;
      local_58[4] = uVar11;
      local_58[5] = uVar12;
      local_58[6] = uVar13;
      local_58[7] = uVar14;
      uVar18 = _REGISTERS[uVar18].length;
      local_58[uVar18] = ':';
      local_58 = local_58 + (ulong)uVar18 + 1;
    }
    bVar3 = di->ops[uVar20].index;
    p_Var7 = _REGISTERS + bVar3;
    uVar8 = p_Var7->p[1];
    uVar9 = p_Var7->p[2];
    uVar10 = p_Var7->p[3];
    uVar11 = p_Var7->p[4];
    uVar12 = p_Var7->p[5];
    uVar13 = p_Var7->field_0xa;
    uVar14 = p_Var7->field_0xb;
    local_58[0] = p_Var7->p[0];
    local_58[1] = uVar8;
    local_58[2] = uVar9;
    local_58[3] = uVar10;
    local_58[4] = uVar11;
    local_58[5] = uVar12;
    local_58[6] = uVar13;
    local_58[7] = uVar14;
    local_58 = local_58 + _REGISTERS[bVar3].length;
    distorm_format_signed_disp(&local_58,di,addrMask);
    *local_58 = ']';
    local_58 = local_58 + 1;
    break;
  case '\a':
    distorm_format_size(&local_58,di,opNum);
    *local_58 = '[';
    local_58 = local_58 + 1;
    if (di->segment < 0x81) {
      uVar18 = di->segment & 0x7f;
      p_Var7 = _REGISTERS + uVar18;
      uVar8 = p_Var7->p[1];
      uVar9 = p_Var7->p[2];
      uVar10 = p_Var7->p[3];
      uVar11 = p_Var7->p[4];
      uVar12 = p_Var7->p[5];
      uVar13 = p_Var7->field_0xa;
      uVar14 = p_Var7->field_0xb;
      local_58[0] = p_Var7->p[0];
      local_58[1] = uVar8;
      local_58[2] = uVar9;
      local_58[3] = uVar10;
      local_58[4] = uVar11;
      local_58[5] = uVar12;
      local_58[6] = uVar13;
      local_58[7] = uVar14;
      uVar18 = _REGISTERS[uVar18].length;
      local_58[uVar18] = ':';
      local_58 = local_58 + (ulong)uVar18 + 1;
    }
    uVar15 = (ulong)di->base;
    if (uVar15 != 0xff) {
      p_Var7 = _REGISTERS + uVar15;
      uVar8 = p_Var7->p[1];
      uVar9 = p_Var7->p[2];
      uVar10 = p_Var7->p[3];
      uVar11 = p_Var7->p[4];
      uVar12 = p_Var7->p[5];
      uVar13 = p_Var7->field_0xa;
      uVar14 = p_Var7->field_0xb;
      local_58[0] = p_Var7->p[0];
      local_58[1] = uVar8;
      local_58[2] = uVar9;
      local_58[3] = uVar10;
      local_58[4] = uVar11;
      local_58[5] = uVar12;
      local_58[6] = uVar13;
      local_58[7] = uVar14;
      uVar18 = _REGISTERS[uVar15].length;
      local_58[uVar18] = '+';
      local_58 = local_58 + (ulong)uVar18 + 1;
    }
    bVar3 = di->ops[uVar20].index;
    p_Var7 = _REGISTERS + bVar3;
    uVar8 = p_Var7->p[1];
    uVar9 = p_Var7->p[2];
    uVar10 = p_Var7->p[3];
    uVar11 = p_Var7->p[4];
    uVar12 = p_Var7->p[5];
    uVar13 = p_Var7->field_0xa;
    uVar14 = p_Var7->field_0xb;
    local_58[0] = p_Var7->p[0];
    local_58[1] = uVar8;
    local_58[2] = uVar9;
    local_58[3] = uVar10;
    local_58[4] = uVar11;
    local_58[5] = uVar12;
    local_58[6] = uVar13;
    local_58[7] = uVar14;
    local_58 = local_58 + _REGISTERS[bVar3].length;
    uVar2 = di->scale;
    if (uVar2 == '\b') {
      local_58[0] = '*';
      local_58[1] = '8';
LAB_00103454:
      local_58 = local_58 + 2;
    }
    else {
      if (uVar2 == '\x04') {
        local_58[0] = '*';
        local_58[1] = '4';
        goto LAB_00103454;
      }
      if (uVar2 == '\x02') {
        local_58[0] = '*';
        local_58[1] = '2';
        goto LAB_00103454;
      }
    }
    distorm_format_signed_disp(&local_58,di,addrMask);
LAB_00103467:
    *local_58 = ']';
    local_58 = local_58 + 1;
    break;
  case '\b':
    x = (ulong)di->size + (di->imm).sqword + di->addr & addrMask;
    goto LAB_0010338f;
  case '\t':
    str_int_impl(&local_58,(ulong)(di->imm).word);
    *local_58 = ':';
    local_58 = local_58 + 1;
    goto switchD_0010313d_caseD_4;
  }
  goto switchD_0010313d_default;
switchD_0010313d_caseD_4:
  x = (uint64_t)(di->imm).ptr.off;
LAB_0010338f:
  str_int_impl(&local_58,x);
switchD_0010313d_default:
  uVar20 = uVar20 + 1;
  result = local_48;
  if (di->opsNo <= uVar20) goto LAB_00103530;
  goto LAB_00103112;
}

Assistant:

_DLLEXPORT_ void distorm_format64(const _CodeInfo* ci, const _DInst* di, _DecodedInst* result)
#else
	_DLLEXPORT_ void distorm_format32(const _CodeInfo* ci, const _DInst* di, _DecodedInst* result)
#endif
{
	unsigned char* str;
	int64_t tmpDisp64;
	uint64_t addrMask = (uint64_t)-1;
	const _WMnemonic* mnemonic;
	int suffixSize = -1;
	unsigned int i;

	/* Set address mask, when default is for 64bits addresses. */
	if (ci->features & DF_USE_ADDR_MASK) addrMask = ci->addrMask;
	else {
		if (ci->features & DF_MAXIMUM_ADDR32) addrMask = 0xffffffff;
		else if (ci->features & DF_MAXIMUM_ADDR16) addrMask = 0xffff;
	}

	/* Gotta have full address for (di->addr - ci->codeOffset) to work in all modes. */
	str_hex(&result->instructionHex, (const uint8_t*)&ci->code[(unsigned int)(di->addr - ci->codeOffset)], di->size);

	if ((int)((int16_t)di->flags) == -1) {
		/* In-place considerations: DI is RESULT. Deref fields first. */
		unsigned int size = di->size;
		unsigned int byte = di->imm.byte;
		_OffsetType offset = di->addr & addrMask;

		result->offset = offset;
		result->size = size;
		str = (unsigned char*)&result->mnemonic.p;
		strcat_WS(str, "DB  ", 4, 3);
		str_int(&str, byte);
		strfinalize_WS(result->mnemonic, str);
		*(uint64_t*)&result->operands = 0; /* Clears length and the string at once. */
		return; /* Skip to next instruction. */
	}

	str = (unsigned char*)&result->operands.p;

	/* Special treatment for String (movs, cmps, stos, lods, scas) instructions. */
	if ((di->opcode >= I_MOVS) && (di->opcode <= I_SCAS)) {
		/*
		 * No operands are needed if the address size is the default one,
		 * and no segment is overridden, so add the suffix letter,
		 * to indicate size of operation and continue to next instruction.
		 */
		if ((SEGMENT_IS_DEFAULT_OR_NONE(di->segment)) && (FLAG_GET_ADDRSIZE(di->flags) == ci->dt)) {
			suffixSize = di->ops[0].size / 8;
			goto skipOperands;
		}
		suffixSize = 0; /* Marks it's a string instruction. */
	}

	for (i = 0; i < di->opsNo; i++) {
		unsigned int type = di->ops[i].type;
		if (i > 0) strcat_WS(str, ", ", 2, 2);
		if (type == O_REG) {
			strcat_WSR(&str, &_REGISTERS[di->ops[i].index]);
		}
		else if (type == O_IMM) {
			/* If the instruction is 'push', show explicit size (except byte imm). */
			if ((di->opcode == I_PUSH) && (di->ops[i].size != 8)) distorm_format_size(&str, di, i);
			/* Special fix for negative sign extended immediates. */
			if ((di->flags & FLAG_IMM_SIGNED) && (di->ops[i].size == 8) && (di->imm.sbyte < 0)) {
				chrcat_WS(str, MINUS_DISP_CHR);
				tmpDisp64 = -di->imm.sbyte;
				str_int(&str, tmpDisp64);
			}
			else {
				/* Notice signedness and size of the immediate. */
				if (di->ops[i].size == 0x20) str_int(&str, di->imm.dword);
				else str_int(&str, di->imm.qword);
			}
		}
		else if (type == O_PC) {
#ifdef SUPPORT_64BIT_OFFSET
			str_int(&str, (di->size + di->imm.sqword + di->addr) & addrMask);
#else
			tmpDisp64 = ((_OffsetType)di->imm.sdword + di->addr + di->size) & (uint32_t)addrMask;
			str_int(&str, tmpDisp64);
#endif
		}
		else if (type == O_DISP) {
			distorm_format_size(&str, di, i);
			chrcat_WS(str, OPEN_CHR);
			if (!SEGMENT_IS_DEFAULT_OR_NONE(di->segment)) {
				strcat_WSR(&str, &_REGISTERS[SEGMENT_GET_UNSAFE(di->segment)]);
				chrcat_WS(str, SEG_OFF_CHR);
			}
			tmpDisp64 = di->disp & addrMask;
			str_int(&str, tmpDisp64);
			chrcat_WS(str, CLOSE_CHR);
		}
		else if (type == O_SMEM) {
			int isDefault;
			int segment;
			distorm_format_size(&str, di, i);
			chrcat_WS(str, OPEN_CHR);

			segment = SEGMENT_GET(di->segment);
			isDefault = SEGMENT_IS_DEFAULT(di->segment);

			/*
			 * This is where we need to take special care for String instructions.
			 * If we got here, it means we need to explicitly show their operands.
			 * The problem with CMPS and MOVS is that they have two(!) memory operands.
			 * So we have to complement(!) them ourselves, since the isntruction structure supplies only the segment that can be overridden.
			 * And make the rest of the String operations explicit.
			 * We ignore default ES/DS in 64 bits.
			 * ["MOVS"], [OPT.REGI_EDI, OPT.REGI_ESI] -- DS can be overridden.
			 * ["CMPS"], [OPT.REGI_ESI, OPT.REGI_EDI] -- DS can be overriden.
			 *
			 * suffixSize == 0 was set above for string opcode already.
			 */
			if (suffixSize == 0) {
				if (((di->opcode == I_MOVS) && (i == 0)) || ((di->opcode == I_CMPS) && (i == 1))) {
					if (ci->dt != Decode64Bits) {
						segment = R_ES;
						isDefault = FALSE;
					}
					else isDefault = TRUE;
				}
				else if (isDefault && ((di->opcode == I_MOVS) || (di->opcode == I_CMPS))) {
					if (ci->dt != Decode64Bits) {
						segment = R_DS;
						isDefault = FALSE;
					}
				}
			}
			if (!isDefault && (segment != R_NONE)) {
				strcat_WSR(&str, &_REGISTERS[segment]);
				chrcat_WS(str, SEG_OFF_CHR);
			}

			strcat_WSR(&str, &_REGISTERS[di->ops[i].index]);

			distorm_format_signed_disp(&str, di, addrMask);
			chrcat_WS(str, CLOSE_CHR);
		}
		else if (type == O_MEM) {
			distorm_format_size(&str, di, i);
			chrcat_WS(str, OPEN_CHR);
			if (!SEGMENT_IS_DEFAULT_OR_NONE(di->segment)) {
				strcat_WSR(&str, &_REGISTERS[SEGMENT_GET_UNSAFE(di->segment)]);
				chrcat_WS(str, SEG_OFF_CHR);
			}
			if (di->base != R_NONE) {
				strcat_WSR(&str, &_REGISTERS[di->base]);
				chrcat_WS(str, PLUS_DISP_CHR);
			}
			strcat_WSR(&str, &_REGISTERS[di->ops[i].index]);
			if (di->scale != 0) {
				switch (di->scale)
				{
					case 2: strcat_WS(str, "*2", 2, 2); break;
					case 4: strcat_WS(str, "*4", 2, 2); break;
					case 8: strcat_WS(str, "*8", 2, 2); break;
				}
			}
			distorm_format_signed_disp(&str, di, addrMask);
			chrcat_WS(str, CLOSE_CHR);
		}
		else if (type == O_PTR) {
			str_int(&str, di->imm.ptr.seg);
			chrcat_WS(str, SEG_OFF_CHR);
			str_int(&str, di->imm.ptr.off);
		}
		else if (type == O_IMM1) {
			str_int(&str, di->imm.ex.i1);
		}
		else if (type == O_IMM2) {
			str_int(&str, di->imm.ex.i2);
		}
	}

skipOperands:

	/* Finalize the operands string. */
	strfinalize_WS(result->operands, str);

	/* Not used anymore.
	if (di->flags & FLAG_HINT_TAKEN) strcat_WSN(str, " ;TAKEN");
	else if (di->flags & FLAG_HINT_NOT_TAKEN) strcat_WSN(str, " ;NOT TAKEN");
	*/
	{
		/* In-place considerations: DI is RESULT. Deref fields first. */
		unsigned int opcode = di->opcode;
		unsigned int prefix = FLAG_GET_PREFIX(di->flags);
		unsigned int size = di->size;
		_OffsetType offset = di->addr & addrMask;
		str = (unsigned char*)&result->mnemonic.p;
		mnemonic = (const _WMnemonic*)&_MNEMONICS[opcode];

		if (prefix) {
			/* REP prefix for CMPS and SCAS is really a REPZ. */
			prefix += (opcode == I_CMPS);
			prefix += (opcode == I_SCAS);
			memcpy(str, &prefixTable[prefix][0], 8);
			str += prefixSizesTable[prefix];
		}

		/*
		 * Always copy 16 bytes from the mnemonic, we have a sentinel padding so we can read past.
		 * This helps the compiler to remove the call to memcpy and therefore makes this copying much faster.
		 * The longest instruction is exactly 16 chars long, so we null terminate the string below.
		 */
		memcpy((int8_t*)str, mnemonic->p, 16);
		str += mnemonic->length;

		if (suffixSize > 0) {
			*str++ = suffixTable[suffixSize];
		}
		strfinalize_WS(result->mnemonic, str);

		result->offset = offset;
		result->size = size;
	}
}